

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int __thiscall fmt::internal::ArgMap<char>::init(ArgMap<char> *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Type TVar3;
  undefined7 extraout_var;
  pair<fmt::BasicStringRef<char>,_fmt::internal::Arg> local_e8;
  uint local_ac;
  undefined1 local_a8 [4];
  uint i_2;
  Type local_70;
  uint local_6c;
  Type arg_type_1;
  uint i_1;
  Type local_2c;
  uint local_28;
  Type arg_type;
  uint i;
  bool use_values;
  NamedArg *named_arg;
  ArgList *args_local;
  ArgMap<char> *this_local;
  int iVar2;
  
  named_arg = (NamedArg *)ctx;
  args_local = (ArgList *)this;
  bVar1 = std::
          vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
          ::empty(&this->map_);
  iVar2 = (int)CONCAT71(extraout_var,bVar1);
  if (bVar1) {
    _i = (NamedArg<char> *)0x0;
    TVar3 = ArgList::type((ArgList *)named_arg,0xf);
    arg_type._3_1_ = TVar3 == NONE;
    if ((bool)arg_type._3_1_) {
      local_28 = 0;
      while (local_2c = ArgList::type((ArgList *)named_arg,local_28), local_2c != NONE) {
        if (local_2c == NAMED_ARG) {
          _i = *(NamedArg<char> **)
                ((named_arg->super_Arg).super_Value.field_0.custom.format + (ulong)local_28 * 0x10);
          std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>::
          pair<const_fmt::internal::NamedArg<char>_&,_true>
                    ((pair<fmt::BasicStringRef<char>,_fmt::internal::Arg> *)&arg_type_1,
                     (BasicStringRef<char> *)&(_i->super_Arg).field_0x18,_i);
          std::
          vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
          ::push_back(&this->map_,(value_type *)&arg_type_1);
        }
        local_28 = local_28 + 1;
      }
      iVar2 = 0;
    }
    else {
      for (local_6c = 0; local_6c != 0x10; local_6c = local_6c + 1) {
        local_70 = ArgList::type((ArgList *)named_arg,local_6c);
        if (local_70 == NAMED_ARG) {
          _i = *(NamedArg<char> **)
                ((named_arg->super_Arg).super_Value.field_0.custom.format + (ulong)local_6c * 0x20);
          std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>::
          pair<const_fmt::internal::NamedArg<char>_&,_true>
                    ((pair<fmt::BasicStringRef<char>,_fmt::internal::Arg> *)local_a8,
                     (BasicStringRef<char> *)&(_i->super_Arg).field_0x18,_i);
          std::
          vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
          ::push_back(&this->map_,(value_type *)local_a8);
        }
      }
      local_ac = 0x10;
      while (iVar2 = *(int *)((named_arg->super_Arg).super_Value.field_0.custom.format +
                             (ulong)local_ac * 0x20 + 0x10), iVar2 != 0) {
        if (iVar2 == 1) {
          _i = *(NamedArg<char> **)
                ((named_arg->super_Arg).super_Value.field_0.custom.format + (ulong)local_ac * 0x20);
          std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>::
          pair<const_fmt::internal::NamedArg<char>_&,_true>
                    (&local_e8,(BasicStringRef<char> *)&(_i->super_Arg).field_0x18,_i);
          std::
          vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
          ::push_back(&this->map_,&local_e8);
        }
        local_ac = local_ac + 1;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

void ArgMap<Char>::init(const ArgList &args)
{
    if (!map_.empty())
        return;
    typedef internal::NamedArg<Char> NamedArg;
    const NamedArg *named_arg = FMT_NULL;
    bool use_values = args.type(ArgList::MAX_PACKED_ARGS - 1) == internal::Arg::NONE;
    if (use_values)
    {
        for (unsigned i = 0; /*nothing*/; ++i)
        {
            internal::Arg::Type arg_type = args.type(i);
            switch (arg_type)
            {
            case internal::Arg::NONE:
                return;
            case internal::Arg::NAMED_ARG:
                named_arg = static_cast<const NamedArg *>(args.values_[i].pointer);
                map_.push_back(Pair(named_arg->name, *named_arg));
                break;
            default:
                /*nothing*/
                ;
            }
        }
        return;
    }
    for (unsigned i = 0; i != ArgList::MAX_PACKED_ARGS; ++i)
    {
        internal::Arg::Type arg_type = args.type(i);
        if (arg_type == internal::Arg::NAMED_ARG)
        {
            named_arg = static_cast<const NamedArg *>(args.args_[i].pointer);
            map_.push_back(Pair(named_arg->name, *named_arg));
        }
    }
    for (unsigned i = ArgList::MAX_PACKED_ARGS; /*nothing*/; ++i)
    {
        switch (args.args_[i].type)
        {
        case internal::Arg::NONE:
            return;
        case internal::Arg::NAMED_ARG:
            named_arg = static_cast<const NamedArg *>(args.args_[i].pointer);
            map_.push_back(Pair(named_arg->name, *named_arg));
            break;
        default:
            /*nothing*/
            ;
        }
    }
}